

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O2

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::EnsureLdFldInlinee
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionBody *inlinee)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar6;
  FunctionCodeGenRuntimeData *this_00;
  undefined1 local_68 [8];
  TrackAllocData data;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> inlineeData;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xac,"(recycler)","recycler");
    if (!bVar2) goto LAB_008941fd;
    *puVar4 = 0;
  }
  uVar3 = FunctionBody::GetInlineCacheCount((this->functionBody).ptr);
  if (uVar3 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xad,"(inlineCacheIndex < functionBody->GetInlineCacheCount())",
                                "inlineCacheIndex < functionBody->GetInlineCacheCount()");
    if (!bVar2) goto LAB_008941fd;
    *puVar4 = 0;
  }
  if (inlinee == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0xae,"(inlinee)","inlinee");
    if (!bVar2) {
LAB_008941fd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pWVar6 = (this->ldFldInlinees).ptr;
  if (pWVar6 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    uVar3 = FunctionBody::GetInlineCacheCount((this->functionBody).ptr);
    data.plusSize = (size_t)uVar3;
    local_68 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_49c6d22;
    data.filename._0_4_ = 0xb2;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
    uVar3 = FunctionBody::GetInlineCacheCount((this->functionBody).ptr);
    pWVar6 = Memory::
             AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>,false>
                       ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar3);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::
    WriteBarrierSet(&this->ldFldInlinees,pWVar6);
    pWVar6 = (this->ldFldInlinees).ptr;
  }
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
            ((WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)&data.line,pWVar6 + inlineCacheIndex
            );
  if (data._32_8_ == 0) {
    local_68 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_49c6d22;
    data.filename._0_4_ = 0xb7;
    pRVar5 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
    this_00 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar5,0x37a1d4);
    FunctionCodeGenRuntimeData(this_00,inlinee);
    pWVar6 = (this->ldFldInlinees).ptr + inlineCacheIndex;
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierSet(pWVar6,this_00);
    data._32_8_ = pWVar6->ptr;
  }
  return (FunctionCodeGenRuntimeData *)data._32_8_;
}

Assistant:

FunctionCodeGenRuntimeData *FunctionCodeGenRuntimeData::EnsureLdFldInlinee(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(inlineCacheIndex < functionBody->GetInlineCacheCount());
        Assert(inlinee);

        if (!ldFldInlinees)
        {
            ldFldInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData *), functionBody->GetInlineCacheCount());
        }
        const auto inlineeData = ldFldInlinees[inlineCacheIndex];
        if (!inlineeData)
        {
            return ldFldInlinees[inlineCacheIndex] = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
        }
        return inlineeData;
    }